

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-multicast-join.c
# Opt level: O0

int do_send(uv_udp_send_t *send_req)

{
  int iVar1;
  uv_buf_t uVar2;
  char *local_50;
  undefined1 local_3c [8];
  sockaddr_in6 addr;
  uv_buf_t buf;
  uv_udp_send_t *send_req_local;
  
  uVar2 = uv_buf_init("PING",4);
  local_50 = uVar2.base;
  addr._20_8_ = local_50;
  iVar1 = uv_ip6_addr("ff02::1",0x23a3,(sockaddr_in6 *)local_3c);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-join6.c"
            ,0x5c,"0 == uv_ip6_addr(MULTICAST_ADDR, TEST_PORT, &addr)");
    abort();
  }
  iVar1 = uv_udp_send(send_req,&client,(uv_buf_t *)((long)&addr.sin6_addr.__in6_u + 0xc),1,
                      (sockaddr *)local_3c,sv_send_cb);
  return iVar1;
}

Assistant:

static int do_send(uv_udp_send_t* send_req) {
  uv_buf_t buf;
  struct sockaddr_in addr;
  
  buf = uv_buf_init("PING", 4);

  ASSERT(0 == uv_ip4_addr(MULTICAST_ADDR, TEST_PORT, &addr));

  /* client sends "PING" */
  return uv_udp_send(send_req,
                     &client,
                     &buf,
                     1,
                     (const struct sockaddr*) &addr,
                     sv_send_cb);
}